

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices
          (GeomPrimvar *this,double t,Value *dest,TimeSampleInterpolationType tinterp,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  string *args;
  uint *args_00;
  storage_t<unsigned_int> elementSize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  undefined1 uVar4;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  Value v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  vector<int,_std::allocator<int>_> indices;
  Value val;
  string err_msg;
  undefined1 local_110 [32];
  _Bit_pointer local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  bool local_c8;
  double local_c0;
  undefined1 local_b8 [8];
  pointer pcStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Bit_pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  storage_union local_68;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (dest == (Value *)0x0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    goto LAB_00187297;
  }
  args = err;
  local_c0 = t;
  if (((this->_attr)._var._blocked == false) &&
     ((((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar3 = (*pvVar1->type_id)(), uVar3 == 0)) ||
       ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
        (uVar3 = (*pvVar1->type_id)(), uVar3 == 1)))) &&
      ((this->_attr)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (this->_attr)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start)))) goto LAB_00187297;
  this_00 = &this->_attr;
  uVar3 = Attribute::type_id(this_00);
  bVar2 = IsSupportedGeomPrimvarType(uVar3);
  if (!bVar2) {
    if (err != (string *)0x0) {
      local_b8 = (undefined1  [8])&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Unsupported type for GeomPrimvar. type = `{}`","");
      Attribute::type_name_abi_cxx11_((string *)local_e8,this_00);
      fmt::format<std::__cxx11::string>((string *)local_110,(fmt *)local_b8,(string *)local_e8,args)
      ;
      std::__cxx11::string::_M_append((char *)err,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
    }
    goto LAB_00187297;
  }
  local_58 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_68.dynamic = (void *)0x0;
  uVar3 = Attribute::type_id(this_00);
  if ((uVar3 >> 0x14 & 1) == 0) {
    local_d8._M_allocated_capacity =
         (size_type)linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_e8._0_8_ = (pointer)0x0;
    bVar2 = primvar::PrimVar::get_interpolated_value
                      (&(this->_attr)._var,local_c0,tinterp,(Value *)local_e8);
    if (bVar2) {
      linb::any::operator=(&dest->v_,(any *)local_e8);
    }
    else if (err != (string *)0x0) {
      local_b8 = (undefined1  [8])&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Failed to evaluate Attribute value.","");
      fmt::format((string *)local_110,(string *)local_b8);
      std::__cxx11::string::_M_append((char *)err,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
    }
    if ((vtable_type *)local_d8._M_allocated_capacity != (vtable_type *)0x0) {
      (**(_func_void_storage_union_ptr **)(local_d8._M_allocated_capacity + 0x20))
                ((storage_union *)local_e8);
      local_d8._M_allocated_capacity = 0;
    }
    uVar4 = '\0';
    goto LAB_0018726f;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  elementSize = (storage_t<unsigned_int>)0x1;
  if ((this->_attr)._metas.elementSize.has_value_ != false) {
    elementSize = (this->_attr)._metas.elementSize.contained;
  }
  local_88.field_2._M_allocated_capacity = 0;
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  if (NAN(local_c0)) {
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&local_88,&this->_indices);
  }
  else {
    TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
    get<std::vector<int,_std::allocator<int>_>,_nullptr>
              (&this->_ts_indices,(vector<int,_std::allocator<int>_> *)&local_88,local_c0,tinterp);
  }
  uVar3 = Attribute::type_id(this_00);
  uVar4 = '\0';
  args_00 = &switchD_00185686::switchdataD_002521d8;
  switch(uVar3) {
  case 0x100007:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (this_00,local_c0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::__cxx11::string>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,in_R9);
      if (local_f0._0_1_ == true) {
        uVar4 = local_110[0];
        if ((value_type_conflict)local_110[0] == true) {
          linb::any::operator=
                    ((any *)&local_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_e8);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_50);
        uVar4 = '\0';
      }
      if ((local_f0._0_1_ == false) && ((undefined1 *)local_110._0_8_ != local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  default:
    goto switchD_00185686_caseD_100008;
  case 0x100009:
    uVar4 = '\0';
    local_110._0_8_ = (pointer)0x0;
    local_110._8_4_ = 0;
    local_110._16_8_ = 0;
    local_110._24_4_ = 0;
    local_f0 = (_Bit_pointer)0x0;
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)((ulong)pcStack_b0 & 0xffffffff00000000);
    local_a8._M_allocated_capacity = 0;
    local_a8._8_4_ = 0;
    local_98 = (_Bit_pointer)0x0;
    bVar2 = Attribute::get<std::vector<bool,std::allocator<bool>>>
                      (this_00,local_c0,(vector<bool,_std::allocator<bool>_> *)local_110,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<bool>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_e8,(vector<bool,_std::allocator<bool>_> *)local_110,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args_00,
                 (vector<bool,_std::allocator<bool>_> *)local_b8);
      if (local_c8 == true) {
        uVar4 = local_e8[0];
        if ((value_type_conflict)local_e8[0] == true) {
          linb::any::operator=((any *)&local_68,(vector<bool,_std::allocator<bool>_> *)local_b8);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_50);
        uVar4 = '\0';
      }
      if ((local_c8 == false) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != &local_d8)) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8,(long)local_98 - (long)local_b8);
      local_b8 = (undefined1  [8])0x0;
      pcStack_b0 = (pointer)((ulong)pcStack_b0 & 0xffffffff00000000);
      local_a8._M_allocated_capacity = 0;
      local_a8._8_4_ = 0;
      local_98 = (_Bit_pointer)0x0;
    }
    if ((pointer)local_110._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_110._0_8_,(long)local_f0 - local_110._0_8_);
      local_110._0_8_ = (pointer)0x0;
      local_110._8_4_ = 0;
      local_110._16_8_ = 0;
      local_110._24_4_ = 0;
      local_f0 = (_Bit_pointer)0x0;
    }
    goto switchD_00185686_caseD_100008;
  case 0x10000e:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::half>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_b8,
                 (uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_e8);
      if (local_f0._0_1_ == true) {
        uVar4 = local_110[0];
        if ((value_type_conflict)local_110[0] == true) {
          linb::any::operator=
                    ((any *)&local_68,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     local_e8);
        }
      }
      else {
LAB_001870b5:
        std::__cxx11::string::_M_assign((string *)&local_50);
        uVar4 = '\0';
      }
LAB_001870ca:
      if ((local_f0._0_1_ == false) && ((undefined1 *)local_110._0_8_ != local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
    }
    break;
  case 0x10000f:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<int,std::allocator<int>>>
                      (this_00,local_c0,(vector<int,_std::allocator<int>_> *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<int>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(vector<int,_std::allocator<int>_> *)local_b8,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=((any *)&local_68,(vector<int,_std::allocator<int>_> *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100011:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,2ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100012:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,3ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100013:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,4ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100014:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,2ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)local_e8)
        ;
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100015:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,3ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)local_e8)
        ;
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100016:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,4ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_e8)
        ;
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10001b:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      (this_00,local_c0,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<unsigned_int>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8,
                 (uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_e8)
        ;
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100025:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,2ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100026:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,3ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100027:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,4ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100028:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<float,std::allocator<float>>>
                      (this_00,local_c0,(vector<float,_std::allocator<float>_> *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<float>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(vector<float,_std::allocator<float>_> *)local_b8,
                 (uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<float,_std::allocator<float>_> *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=((any *)&local_68,(vector<float,_std::allocator<float>_> *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100029:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,2ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002a:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,3ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002b:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,4ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)in_R9);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002c:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::get<std::vector<double,std::allocator<double>>>
                      (this_00,local_c0,(vector<double,_std::allocator<double>_> *)local_b8,tinterp)
    ;
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<double>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(vector<double,_std::allocator<double>_> *)local_b8,
                 (uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<double,_std::allocator<double>_> *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=((any *)&local_68,(vector<double,_std::allocator<double>_> *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002d:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,2ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)in_R9
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002e:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *
                       )local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,3ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)in_R9
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10002f:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                      (this_00,local_c0,
                       (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *
                       )local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,4ul>>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,(_anonymous_namespace_ *)local_b8,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args_00,
                 (vector<int,_std::allocator<int>_> *)local_e8,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)in_R9
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100030:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quath>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)local_b8
                 ,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)local_e8
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100031:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatf>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)local_b8
                 ,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)local_e8
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100032:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                       local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatd>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)local_b8
                 ,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)local_e8
                );
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100036:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix2d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100037:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100038:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix4d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10003a:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10003b:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10003d:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10003e:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10003f:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3h>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100040:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100041:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100042:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3h>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100043:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100044:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100045:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3h>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100046:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100047:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                   local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x100049:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2h>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10004a:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10004b:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10004c:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3h>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10004d:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3f>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
    break;
  case 0x10004e:
    local_b8 = (undefined1  [8])0x0;
    pcStack_b0 = (pointer)0x0;
    uVar4 = '\0';
    local_a8._M_allocated_capacity = 0;
    local_d8._M_allocated_capacity = 0;
    local_e8._0_8_ = (pointer)0x0;
    local_e8._8_8_ = 0;
    bVar2 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                      (this_00,local_c0,
                       (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                        *)local_b8,tinterp);
    if (bVar2) {
      args_00 = (uint *)&local_88;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3d>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)local_b8,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args_00,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)local_e8);
      if (local_f0._0_1_ != true) goto LAB_001870b5;
      uVar4 = local_110[0];
      if ((value_type_conflict)local_110[0] == true) {
        linb::any::operator=
                  ((any *)&local_68,
                   (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                    *)local_e8);
      }
      goto LAB_001870ca;
    }
  }
  if ((pointer)local_e8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._0_8_,local_d8._M_allocated_capacity - local_e8._0_8_);
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,local_a8._M_allocated_capacity - (long)local_b8);
  }
switchD_00185686_caseD_100008:
  if (uVar4 == '\0') {
    if (err != (string *)0x0) {
      local_b8 = (undefined1  [8])&local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
                 "");
      Attribute::type_name_abi_cxx11_((string *)local_e8,this_00);
      fmt::format<std::__cxx11::string>
                ((string *)local_110,(fmt *)local_b8,(string *)local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_00);
      std::__cxx11::string::_M_append((char *)err,local_110._0_8_);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (local_b8 != (undefined1  [8])&local_a8) {
        operator_delete((void *)local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (local_50._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_110,"\n",&local_50);
        std::__cxx11::string::_M_append((char *)err,local_110._0_8_);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
      }
    }
  }
  else {
    linb::any::operator=(&dest->v_,(any *)&local_68);
  }
  if (local_88._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_88._M_dataplus._M_p,
                    local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = true;
LAB_0018726f:
  if (local_58 != (undefined1 *)0x0) {
    (**(code **)(local_58 + 0x20))(&local_68);
  }
  if (bVar2 == false) {
LAB_00187297:
    uVar4 = '\0';
  }
  return (bool)uVar4;
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, value::Value *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  bool processed = false;

  if (_attr.has_value() || _attr.has_timesamples()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    value::Value val;

    if (!(_attr.type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {

      // evaluate value at specified time and return it for scalar type.
      value::Value v;
      if (!_attr.get_var().get_interpolated_value(t, tinterp, &v)) {
        if (err) {
          (*err) += fmt::format("Failed to evaluate Attribute value.");
        }
        return false;
      }
      (*dest) = v;
    } else {
      std::string err_msg;

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      std::vector<int32_t> indices;
      // Get indices at specified time
      if (value::TimeCode(t).is_default()) {
        indices = _indices;
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

#define APPLY_FUN(__ty)                                                  \
  case value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT: { \
    std::vector<__ty> value; \
    std::vector<__ty> expanded_val;                                      \
    if (_attr.get_value(t, &value, tinterp)) {                \
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val); \
      if (ret) {                                                         \
        processed = ret.value();                                         \
        if (processed) {                                                 \
          val = expanded_val;                                            \
        }                                                                \
      } else {                                                           \
        err_msg = ret.error();                                           \
      }                                                                  \
    }                                                                    \
    break;                                                               \
  }

      switch (_attr.type_id()) {
        APPLY_GEOMPRIVAR_TYPE(APPLY_FUN)
        default: {
          processed = false;
        }
      }

#undef APPLY_FUN

      if (processed) {
        (*dest) = std::move(val);
      } else {
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    }
  }

  return processed;
}